

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParamGenerator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int)> __thiscall
testing::internal::ValueArray::operator_cast_to_ParamGenerator(ValueArray *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ParamGenerator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int)> PVar1;
  _Vector_base<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int),_std::allocator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int)>_>
  _Stack_28;
  
  ValueArray<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int)>::
  MakeVector<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int),0ul>(&_Stack_28);
  ValuesIn<std::vector<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int),std::allocator<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int)>>>
            ((testing *)this,
             (vector<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int),_std::allocator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int)>_>
              *)&_Stack_28);
  std::
  _Vector_base<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int),_std::allocator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int)>_>
  ::~_Vector_base(&_Stack_28);
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int)>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  PVar1.impl_.
  super___shared_ptr<const_testing::internal::ParamGeneratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int)>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ParamGenerator<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int)>)
         PVar1.impl_.
         super___shared_ptr<const_testing::internal::ParamGeneratorInterface<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int)>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

operator ParamGenerator<T>() const {  // NOLINT
    return ValuesIn(MakeVector<T>(MakeIndexSequence<sizeof...(Ts)>()));
  }